

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O0

void ExchCXX::detail::host_eval_exc_helper_polar<ExchCXX::BuiltinSCANL_X>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps)

{
  undefined8 *tau_a;
  double in_RCX;
  long in_RDX;
  double in_RSI;
  int in_EDI;
  double in_R8;
  double in_R9;
  double lapl_i_b;
  double lapl_i_a;
  double *lapl_i;
  double *tau_i;
  double *sigma_i;
  double *rho_i;
  int32_t i;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < in_EDI; iVar1 = iVar1 + 1) {
    tau_a = (undefined8 *)((long)in_RCX + (long)(iVar1 << 1) * 8);
    kernel_traits<ExchCXX::Deorbitalized<ExchCXX::BuiltinSCAN_X,_ExchCXX::BuiltinPC07OPT_K>_>::
    eval_exc_polar(in_RCX,in_R8,in_R9,(double)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
                   (double)((long)in_RSI + (long)(iVar1 << 1) * 8),
                   (double)(in_RDX + (long)(iVar1 * 3) * 8),
                   (double)((long)in_R8 + (long)(iVar1 << 1) * 8),(double)tau_a,in_RSI,
                   (double *)*tau_a);
  }
  return;
}

Assistant:

MGGA_EXC_GENERATOR( host_eval_exc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i   = rho   + 2*i;
    auto* sigma_i = sigma + 3*i;
    auto* tau_i   = tau   + 2*i;
    auto* lapl_i  = lapl  + 2*i;

    const auto lapl_i_a = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const auto lapl_i_b = traits::needs_laplacian ? lapl_i[1] : 0.0;
   
    traits::eval_exc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_i_a, lapl_i_b, tau_i[0], tau_i[1], 
      eps[i] );

  }

}